

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  int *piVar4;
  VdbeOp *pVVar5;
  u8 uVar6;
  int iVar7;
  Parse *pPVar8;
  TriggerPrg *pTVar9;
  SubProgram *pSVar10;
  Parse *pParse_00;
  Vdbe *pVVar11;
  char *zP4;
  Expr *pEVar12;
  SrcList *pSVar13;
  ExprList *pChanges;
  IdList *pColumn;
  Select *pSVar14;
  TriggerPrg **ppTVar15;
  TriggerStep *pStep;
  uint local_d0;
  undefined1 local_88 [20];
  undefined4 local_74;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar8 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar8 = pParse;
  }
  ppTVar1 = &pPVar8->pTriggerPrg;
  ppTVar15 = ppTVar1;
  while( true ) {
    pTVar9 = *ppTVar15;
    if (pTVar9 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar9 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar9 != (TriggerPrg *)0x0) {
        pTVar9->pNext = *ppTVar1;
        *ppTVar1 = pTVar9;
        pSVar10 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
        pTVar9->pProgram = pSVar10;
        if (pSVar10 != (SubProgram *)0x0) {
          pVVar11 = pPVar8->pVdbe;
          pSVar10->pNext = pVVar11->pProgram;
          pVVar11->pProgram = pSVar10;
          pTVar9->pTrigger = pTrigger;
          pTVar9->orconf = orconf;
          pTVar9->aColmask[0] = 0xffffffff;
          pTVar9->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x250);
          if (pParse_00 != (Parse *)0x0) {
            local_40 = (undefined1  [16])0x0;
            local_50 = (undefined1  [16])0x0;
            local_68._8_16_ = (undefined1  [16])0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar8;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            local_68._0_8_ = pParse_00;
            pVVar11 = sqlite3GetVdbe(pParse_00);
            if (pVVar11 != (Vdbe *)0x0) {
              local_d0 = 0;
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar11,-1,zP4,-7);
              if (pTrigger->pWhen != (Expr *)0x0) {
                local_d0 = 0;
                pEVar12 = sqlite3ExprDup(db,pTrigger->pWhen,0);
                iVar7 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar12);
                if ((iVar7 == 0) && (db->mallocFailed == '\0')) {
                  local_d0 = sqlite3VdbeMakeLabel(pVVar11);
                  sqlite3ExprIfFalse(pParse_00,pEVar12,local_d0,0x10);
                }
                sqlite3ExprDelete(db,pEVar12);
              }
              db_00 = pParse_00->db;
              p = pParse_00->pVdbe;
              pStep = (TriggerStep *)pTrigger;
              while (pStep = pStep->pNext, pStep != (TriggerStep *)0x0) {
                uVar6 = (u8)orconf;
                if (orconf == 10) {
                  uVar6 = pStep->orconf;
                }
                pParse_00->eOrconf = uVar6;
                uVar6 = pStep->op;
                if (uVar6 == 'l') {
                  pSVar13 = targetSrcList(pParse_00,pStep);
                  pSVar14 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                  sqlite3Insert(pParse_00,pSVar13,pSVar14,pColumn,(uint)pParse_00->eOrconf);
                }
                else if (uVar6 == 'm') {
                  pSVar13 = targetSrcList(pParse_00,pStep);
                  pEVar12 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3DeleteFrom(pParse_00,pSVar13,pEVar12);
                }
                else if (uVar6 == 'n') {
                  pSVar13 = targetSrcList(pParse_00,pStep);
                  pChanges = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                  pEVar12 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3Update(pParse_00,pSVar13,pChanges,pEVar12,(uint)pParse_00->eOrconf);
                }
                else {
                  pSVar14 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  local_88[0] = '\x04';
                  local_88._4_16_ = (undefined1  [16])0x0;
                  local_74 = 0;
                  sqlite3Select(pParse_00,pSVar14,(SelectDest *)local_88);
                  sqlite3SelectDelete(db_00,pSVar14);
                }
                if (pStep->op != 'w') {
                  sqlite3VdbeAddOp0(p,0x77);
                }
              }
              if ((local_d0 != 0) && (piVar4 = pVVar11->pParse->aLabel, piVar4 != (int *)0x0)) {
                piVar4[(int)~local_d0] = pVVar11->nOp;
              }
              sqlite3VdbeAddOp0(pVVar11,0x37);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
                pParse->rc = pParse_00->rc;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar5 = pVVar11->aOp;
                resolveP2Values(pVVar11,&pPVar8->nMaxArg);
                pSVar10->nOp = pVVar11->nOp;
                pVVar11->aOp = (Op *)0x0;
                pSVar10->aOp = pVVar5;
              }
              uVar2 = pParse_00->nTab;
              uVar3 = pParse_00->nMem;
              pSVar10->nMem = uVar3;
              pSVar10->nCsr = uVar2;
              pSVar10->token = pTrigger;
              pTVar9->aColmask[0] = pParse_00->oldmask;
              pTVar9->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar11);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFreeNN(db,pParse_00);
            return pTVar9;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar9->pTrigger == pTrigger) && (pTVar9->orconf == orconf)) break;
    ppTVar15 = &pTVar9->pNext;
  }
  return pTVar9;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}